

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPExtImplementationDefinedRequirementClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPExtImplementationDefinedRequirementClause *this)

{
  pointer pcVar1;
  string ext_user_defined_implementation;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  local_40 = 0;
  local_38 = 0;
  pcVar1 = (this->implementation_defined_requirement)._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,
             pcVar1 + (this->implementation_defined_requirement)._M_string_length);
  std::operator+(&local_88,"ext_",&local_68);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPExtImplementationDefinedRequirementClause::toString() {
    std::string result = "";
    std::string parameter_string;

    std::string ext_user_defined_implementation = this->getImplementationDefinedRequirement();
    result += "ext_" + ext_user_defined_implementation;
    result += " ";
    return result;
}